

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::
basic_csv_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_next(basic_csv_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
            *this,basic_json_visitor<char> *visitor,error_code *ec)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *data;
  char *length;
  type tVar5;
  
  (this->parser_).more_ = true;
  do {
    if ((this->parser_).input_ptr_ == (this->parser_).input_end_) {
      pcVar3 = (this->source_).source_.current_.p_;
      pcVar4 = (this->source_).source_.end_.p_;
      if (pcVar3 == pcVar4) {
LAB_002b9218:
        length = (char *)0x0;
        pcVar3 = (char *)0x0;
      }
      else {
        data = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
        length = (char *)(this->source_).source_.buffer_length_;
        if (length == (char *)0x0) {
          pcVar2 = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          length = (char *)0x0;
          while ((data + (long)length < pcVar2 && (pcVar3 != pcVar4))) {
            data[(long)length] = *pcVar3;
            pcVar4 = (this->source_).source_.end_.p_;
            pcVar3 = (this->source_).source_.current_.p_ + 1;
            (this->source_).source_.current_.p_ = pcVar3;
            length = length + 1;
          }
          psVar1 = &(this->source_).source_.position_;
          *psVar1 = (size_t)(length + *psVar1);
          data = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        }
        (this->source_).source_.buffer_length_ = 0;
        pcVar3 = data;
        if ((length != (char *)0x0) && ((this->source_).bof_ != false)) {
          tVar5 = unicode_traits::detect_encoding_from_bom<char>(data,(size_t)length);
          pcVar3 = tVar5.ptr;
          if (utf8 < tVar5.encoding) {
            std::error_code::operator=(ec,illegal_unicode_character);
            goto LAB_002b9218;
          }
          length = data + ((long)length - (long)pcVar3);
          (this->source_).bof_ = false;
        }
      }
      if (ec->_M_value != 0) {
        return;
      }
      if (length != (char *)0x0) {
        (this->parser_).begin_input_ = pcVar3;
        (this->parser_).input_end_ = pcVar3 + (long)length;
        (this->parser_).input_ptr_ = pcVar3;
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some(&this->parser_,visitor,ec);
    if (ec->_M_value != 0) {
      return;
    }
    if (((this->parser_).more_ & 1U) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                }
            }
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }
    }